

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O0

RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> * __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::replaceWithChild(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                   *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_28;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *child;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node_local;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
  *this_local;
  
  if ((node->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_right == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    local_28 = (node->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
  }
  else {
    local_28 = (node->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
  }
  if ((node->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    this->m_root = local_28;
  }
  else if (node == (((node->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_parent)->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_left) {
    (((node->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = local_28;
  }
  else {
    (((node->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = local_28;
  }
  if (local_28 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (local_28->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = (node->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent;
  }
  return local_28;
}

Assistant:

Node*
	replaceWithChild(Node* node) {
		Node* child = node->m_right ? node->m_right : node->m_left;

		if (!node->m_parent) {
			ASSERT(node == m_root);
			m_root = child;
		} else if (node == node->m_parent->m_left)
			node->m_parent->m_left = child;
		else
			node->m_parent->m_right = child;

		if (child)
			child->m_parent = node->m_parent;

		return child;
	}